

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# re2.cc
# Opt level: O0

bool re2::RE2::Arg::parse_long_radix(char *str,size_t n,void *dest,int radix)

{
  char *__nptr;
  int *piVar1;
  long lVar2;
  int in_ECX;
  long *in_RDX;
  long in_RSI;
  long r;
  char *end;
  char buf [33];
  char *local_50;
  bool in_stack_ffffffffffffffbf;
  size_t *in_stack_ffffffffffffffc0;
  char *in_stack_ffffffffffffffc8;
  size_t in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd8;
  bool local_1;
  
  if (in_RSI == 0) {
    local_1 = false;
  }
  else {
    __nptr = TerminateNumber((char *)CONCAT44(in_ECX,in_stack_ffffffffffffffd8),
                             in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,
                             in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbf);
    piVar1 = __errno_location();
    *piVar1 = 0;
    lVar2 = strtol(__nptr,&local_50,in_ECX);
    if (local_50 == __nptr + in_RSI) {
      piVar1 = __errno_location();
      if (*piVar1 == 0) {
        if (in_RDX == (long *)0x0) {
          local_1 = true;
        }
        else {
          *in_RDX = lVar2;
          local_1 = true;
        }
      }
      else {
        local_1 = false;
      }
    }
    else {
      local_1 = false;
    }
  }
  return local_1;
}

Assistant:

bool RE2::Arg::parse_long_radix(const char* str,
                                size_t n,
                                void* dest,
                                int radix) {
  if (n == 0) return false;
  char buf[kMaxNumberLength+1];
  str = TerminateNumber(buf, sizeof buf, str, &n, false);
  char* end;
  errno = 0;
  long r = strtol(str, &end, radix);
  if (end != str + n) return false;   // Leftover junk
  if (errno) return false;
  if (dest == NULL) return true;
  *(reinterpret_cast<long*>(dest)) = r;
  return true;
}